

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcEdgeLogDerivativesPartials
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *postOrderPartial,double *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          double *categoryWeights,int scalingFactorsIndex,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  double dVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  
  lVar14 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
  if (0 < lVar14) {
    pdVar11 = (this->super_BeagleCPUImpl<double,_1,_0>).gTransitionMatrices[firstDerivativeIndex];
    uVar9 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
    iVar10 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
    pdVar12 = (this->super_BeagleCPUImpl<double,_1,_0>).grandDenominatorDerivTmp;
    pdVar13 = (this->super_BeagleCPUImpl<double,_1,_0>).grandNumeratorDerivTmp;
    lVar17 = 0;
    lVar18 = 0;
    iVar15 = 0;
    do {
      if (0 < (int)uVar9) {
        lVar1 = (long)iVar15 * 8;
        lVar2 = (long)iVar15 * 8;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = categoryWeights[lVar17];
        auVar26._8_8_ = 0;
        auVar26._0_8_ = pdVar11[lVar18];
        auVar27._8_8_ = 0;
        auVar27._0_8_ = pdVar11[lVar18 + 1];
        auVar28._8_8_ = 0;
        auVar28._0_8_ = pdVar11[lVar18 + 2];
        auVar29._8_8_ = 0;
        auVar29._0_8_ = pdVar11[lVar18 + 3];
        auVar30._8_8_ = 0;
        auVar30._0_8_ = pdVar11[lVar18 + 5];
        auVar31._8_8_ = 0;
        auVar31._0_8_ = pdVar11[lVar18 + 6];
        auVar32._8_8_ = 0;
        auVar32._0_8_ = pdVar11[lVar18 + 7];
        auVar33._8_8_ = 0;
        auVar33._0_8_ = pdVar11[lVar18 + 8];
        auVar34._8_8_ = 0;
        auVar34._0_8_ = pdVar11[lVar18 + 10];
        auVar35._8_8_ = 0;
        auVar35._0_8_ = pdVar11[lVar18 + 0xb];
        auVar36._8_8_ = 0;
        auVar36._0_8_ = pdVar11[lVar18 + 0xc];
        auVar37._8_8_ = 0;
        auVar37._0_8_ = pdVar11[lVar18 + 0xd];
        auVar38._8_8_ = 0;
        auVar38._0_8_ = pdVar11[lVar18 + 0xf];
        auVar39._8_8_ = 0;
        auVar39._0_8_ = pdVar11[lVar18 + 0x10];
        auVar40._8_8_ = 0;
        auVar40._0_8_ = pdVar11[lVar18 + 0x11];
        dVar4 = pdVar11[lVar18 + 0x12];
        lVar16 = 0;
        do {
          uVar5 = *(ulong *)((long)postOrderPartial + lVar16 * 4 + lVar1);
          uVar6 = *(ulong *)((long)postOrderPartial + lVar16 * 4 + lVar1 + 8);
          uVar7 = *(ulong *)((long)postOrderPartial + lVar16 * 4 + lVar1 + 0x10);
          uVar8 = *(ulong *)((long)postOrderPartial + lVar16 * 4 + lVar1 + 0x18);
          auVar22._8_8_ = 0;
          auVar22._0_8_ = uVar6;
          auVar19 = vmulsd_avx512f(auVar27,auVar22);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = uVar5;
          auVar19 = vfmadd231sd_avx512f(auVar19,auVar26,auVar21);
          auVar42._8_8_ = 0;
          auVar42._0_8_ = uVar7;
          auVar19 = vfmadd231sd_avx512f(auVar19,auVar28,auVar42);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar8;
          auVar20 = vfmadd231sd_avx512f(auVar19,auVar29,auVar44);
          auVar19 = vmulsd_avx512f(auVar31,auVar22);
          auVar19 = vfmadd231sd_avx512f(auVar19,auVar30,auVar21);
          auVar19 = vfmadd231sd_avx512f(auVar19,auVar32,auVar42);
          auVar21 = vfmadd231sd_avx512f(auVar19,auVar33,auVar44);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar6;
          auVar19 = vmulsd_avx512f(auVar35,auVar41);
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar5;
          auVar19 = vfmadd231sd_avx512f(auVar19,auVar34,auVar24);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar7;
          auVar19 = vfmadd231sd_avx512f(auVar19,auVar36,auVar43);
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar8;
          auVar22 = vfmadd231sd_avx512f(auVar19,auVar37,auVar45);
          auVar19 = vmulsd_avx512f(auVar39,auVar41);
          auVar19 = vfmadd231sd_avx512f(auVar19,auVar38,auVar24);
          auVar19 = vfmadd231sd_avx512f(auVar19,auVar40,auVar43);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = dVar4;
          auVar23 = vfmadd231sd_avx512f(auVar19,auVar23,auVar45);
          auVar47._8_8_ = 0;
          auVar47._0_8_ = *(ulong *)((long)preOrderPartial + lVar16 * 4 + lVar2 + 8);
          auVar19 = vmulsd_avx512f(auVar41,auVar47);
          auVar46._8_8_ = 0;
          auVar46._0_8_ = *(ulong *)((long)preOrderPartial + lVar16 * 4 + lVar2);
          auVar19 = vfmadd231sd_avx512f(auVar19,auVar46,auVar24);
          auVar48._8_8_ = 0;
          auVar48._0_8_ = *(ulong *)((long)preOrderPartial + lVar16 * 4 + lVar2 + 0x10);
          auVar19 = vfmadd231sd_avx512f(auVar19,auVar48,auVar43);
          auVar49._8_8_ = 0;
          auVar49._0_8_ = *(ulong *)((long)preOrderPartial + lVar16 * 4 + lVar2 + 0x18);
          auVar24 = vfmadd231sd_avx512f(auVar19,auVar49,auVar45);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = *(ulong *)((long)pdVar12 + lVar16);
          auVar19 = vfmadd213sd_avx512f(auVar24,auVar25,auVar19);
          puVar3 = (undefined8 *)((long)pdVar12 + lVar16);
          vmovsd_avx512f(auVar19);
          *puVar3 = *puVar3;
          auVar19 = vmulsd_avx512f(auVar21,auVar47);
          auVar19 = vfmadd231sd_avx512f(auVar19,auVar46,auVar20);
          auVar19 = vfmadd231sd_avx512f(auVar19,auVar48,auVar22);
          auVar19 = vfmadd231sd_avx512f(auVar19,auVar49,auVar23);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = *(ulong *)((long)pdVar13 + lVar16);
          auVar19 = vfmadd213sd_avx512f(auVar19,auVar25,auVar20);
          puVar3 = (undefined8 *)((long)pdVar13 + lVar16);
          vmovsd_avx512f(auVar19);
          *puVar3 = *puVar3;
          lVar16 = lVar16 + 8;
        } while ((ulong)uVar9 << 3 != lVar16);
      }
      lVar18 = lVar18 + 0x14;
      lVar17 = lVar17 + 1;
      iVar15 = iVar15 + iVar10 * 4;
    } while (lVar17 != lVar14);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesPartials(const REALTYPE *postOrderPartial,
                                                                             const REALTYPE *preOrderPartial,
                                                                             const int firstDerivativeIndex,
                                                                             const int secondDerivativeIndex,
                                                                             const double *categoryRates,
                                                                             const REALTYPE *categoryWeights,
                                                                             const int scalingFactorsIndex,
                                                                             double *outDerivatives,
                                                                             double *outSumDerivatives,
                                                                             double *outSumSquaredDerivatives) {

    const REALTYPE* transMatrix = gTransitionMatrices[firstDerivativeIndex];

    int w = 0;
    for(int l = 0; l < kCategoryCount; l++) {

        int v = l*kPaddedPatternCount*4;

        const REALTYPE weight = categoryWeights[l];

        PREFETCH_MATRIX(1,transMatrix,w); // TODO Use _TRANSPOSE and then reverse integration below

        for(int k = 0; k < kPatternCount; k++) {

            PREFETCH_PARTIALS(1, postOrderPartial,v);
            PREFETCH_PARTIALS(0, preOrderPartial, v);


            DO_INTEGRATION(1);

//            grandNumeratorDerivTmp[k] += (sum10 * prePartials[v] + sum11 * prePartials[v + 1]
//                    + sum12 * prePartials[v + 2] + sum13 * prePartials[v + 3]) * weight;
//            grandDenominatorDerivTmp[k] += (postPartials[v] * prePartials[v] + postPartials[v + 1] * prePartials[v + 1]
//                    + postPartials[v + 2] * prePartials[v + 2] + postPartials[v + 3] * prePartials[v + 3]) * weight;

            grandDenominatorDerivTmp[k] += (p10 * p00 + p11 * p01 + p12 * p02 + p13 * p03) * weight;
            grandNumeratorDerivTmp[k] += (sum10 * p00 + sum11 * p01 + sum12 * p02 + sum13 * p03) * weight;

            v += 4;
        }
        w += OFFSET*4;
    }
}